

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::switch_modes(Application *this,uint key)

{
  uint key_local;
  Application *this_local;
  
  switch(key) {
  case 0x41:
  case 0x61:
    to_animate_mode(this);
    break;
  default:
    break;
  case 0x4d:
  case 0x6d:
    to_model_mode(this);
    break;
  case 0x52:
  case 0x72:
    to_render_mode(this);
    break;
  case 0x56:
  case 0x76:
    to_visualize_mode(this);
  }
  return;
}

Assistant:

void Application::switch_modes(unsigned int key) {
  switch (key) {
    case 'a': case 'A':
        to_animate_mode();
        break;
    case 'm': case 'M':
        to_model_mode();
        break;
    case 'r': case 'R':
        to_render_mode();
        break;
    case 'v': case 'V':
        to_visualize_mode();
        break;
    default:
        break;
  }
}